

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall QHttp2Connection::handlePRIORITY(QHttp2Connection *this)

{
  bool bVar1;
  quint32 qVar2;
  uchar *in_RDI;
  long in_FS_OFFSET;
  char *unaff_retaddr;
  bool exclusive;
  bool noErr;
  quint32 streamID;
  uchar weight;
  quint32 streamDependency;
  uint in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  Frame *this_00;
  
  this_00 = *(Frame **)(in_FS_OFFSET + 0x28);
  qVar2 = Http2::Frame::streamID((Frame *)0x2b7db0);
  if (qVar2 == 0) {
    connectionError(this,streamID,unaff_retaddr);
  }
  else {
    bVar1 = isInvalidStream((QHttp2Connection *)
                            CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                            streamDependency);
    if (bVar1) {
      connectionError(this,streamID,unaff_retaddr);
    }
    else {
      Http2::Frame::priority
                (this_00,(quint32 *)(ulong)(in_stack_fffffffffffffff0 & 0xffffff),in_RDI);
    }
  }
  if (*(Frame **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Connection::handlePRIORITY()
{
    Q_ASSERT(inboundFrame.type() == FrameType::PRIORITY
             || inboundFrame.type() == FrameType::HEADERS);

    const auto streamID = inboundFrame.streamID();
    // RFC 9913, 6.3: If a PRIORITY frame is received with a stream identifier of 0x00, the
    // recipient MUST respond with a connection error
    if (streamID == connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "PRIORITY on 0x0 stream");

    // RFC 9113 6.4: After receiving a RST_STREAM on a stream, the receiver MUST NOT send
    // additional frames for that stream
    if (isInvalidStream(streamID))
        return connectionError(ENHANCE_YOUR_CALM, "PRIORITY on invalid stream");

    // RFC 9913, 6.3:  A PRIORITY frame with a length other than 5 octets MUST be treated as a
    // stream error (Section 5.4.2) of type FRAME_SIZE_ERROR.
    // checked in Frame::validateHeader()
    Q_ASSERT(inboundFrame.type() != FrameType::PRIORITY || inboundFrame.payloadSize() == 5);

    quint32 streamDependency = 0;
    uchar weight = 0;
    const bool noErr = inboundFrame.priority(&streamDependency, &weight);
    Q_UNUSED(noErr);
    Q_ASSERT(noErr);

    const bool exclusive = streamDependency & 0x80000000;
    streamDependency &= ~0x80000000;

    // Ignore this for now ...
    // Can be used for streams (re)prioritization - 5.3
    Q_UNUSED(exclusive);
    Q_UNUSED(weight);
}